

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint MeleeDamage;
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar4;
  PClassActor *MissileType;
  undefined4 extraout_var_01;
  undefined4 in_register_00000014;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  AActor *self;
  char *__assertion;
  bool bVar6;
  FSoundID local_28;
  FName local_24;
  PClass *pPVar3;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003c8cb9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        pPVar3 = (self->super_DThinker).super_DObject.Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
          (self->super_DThinker).super_DObject.Class = pPVar3;
          uVar5 = extraout_RDX;
        }
        bVar6 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar6);
        uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar6);
        defaultparam = (TArray<VMValue,_VMValue> *)
                       CONCAT71((int7)((ulong)defaultparam >> 8),pPVar3 == pPVar4 || bVar6);
        if (pPVar3 != pPVar4 && !bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar4) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c8cb9;
        }
        goto LAB_003c8c22;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003c8ca9;
    self = (AActor *)0x0;
LAB_003c8c22:
    pPVar4 = (self->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self,defaultparam,uVar5,ret);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar4;
    }
    MeleeDamage = pPVar4[1].SpecialInits.Count;
    uVar1 = *(undefined4 *)&pPVar4[1].ParentClass;
    local_24.Index = *(int *)((long)&pPVar4[1].ParentClass + 4);
    pPVar4 = PClass::FindClass(&local_24);
    MissileType = dyn_cast<PClassActor>((DObject *)pPVar4);
    _local_28 = CONCAT44(local_24.Index,uVar1);
    pPVar4 = (self->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar4 = (PClass *)CONCAT44(extraout_var_01,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar4;
    }
    DoAttack(self,true,true,MeleeDamage,&local_28,MissileType,(double)pPVar4[1].Pointers);
    return 0;
  }
LAB_003c8ca9:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003c8cb9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3d3,
                "int AF_AActor_A_ComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, true, true, MeleeDamage, MeleeSound, MissileType, self->GetClass()->MissileHeight);
	return 0;
}